

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O2

bool __thiscall
duckdb::SecretManager::TryLookupTypeInternal(SecretManager *this,string *type,SecretType *type_out)

{
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::SecretType>,_true>
  _Var1;
  bool bVar2;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> uStack_38;
  
  ::std::unique_lock<std::mutex>::unique_lock(&uStack_38,&this->manager_lock);
  _Var1._M_cur = (__node_type *)
                 ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::SecretType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::SecretType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->secret_types)._M_h,type);
  if (_Var1._M_cur == (__node_type *)0x0) {
    ::std::unique_lock<std::mutex>::unlock(&uStack_38);
    AutoloadExtensionForType(this,type);
    ::std::unique_lock<std::mutex>::lock(&uStack_38);
    _Var1._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::SecretType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::SecretType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(this->secret_types)._M_h,type);
    if (_Var1._M_cur == (__node_type *)0x0) {
      bVar2 = false;
      goto LAB_019a12b9;
    }
  }
  bVar2 = true;
  SecretType::operator=
            (type_out,(SecretType *)
                      ((long)&((_Var1._M_cur)->
                              super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::SecretType>,_true>
                              ).
                              super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::SecretType>_>
                              ._M_storage._M_storage + 0x20));
LAB_019a12b9:
  ::std::unique_lock<std::mutex>::~unique_lock(&uStack_38);
  return bVar2;
}

Assistant:

bool SecretManager::TryLookupTypeInternal(const string &type, SecretType &type_out) {
	unique_lock<mutex> lck(manager_lock);
	auto lookup = secret_types.find(type);
	if (lookup != secret_types.end()) {
		type_out = lookup->second;
		return true;
	}

	// Try autoloading
	lck.unlock();
	AutoloadExtensionForType(type);
	lck.lock();

	lookup = secret_types.find(type);
	if (lookup != secret_types.end()) {
		type_out = lookup->second;
		return true;
	}

	return false;
}